

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O3

void av1_model_rd_from_var_lapndz(int64_t var,uint n_log2,uint qstep,int *rate,int64_t *dist)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  if (var == 0) {
    iVar4 = 0;
    lVar5 = 0;
  }
  else {
    uVar3 = ((var >> 1) + ((ulong)qstep * (ulong)qstep << ((byte)n_log2 + 10 & 0x3f))) / (ulong)var;
    uVar7 = 0x3bfdf;
    if (uVar3 < 0x3bfdf) {
      uVar7 = uVar3;
    }
    uVar2 = ((uint)(uVar7 >> 2) & 0x3fffffff) + 8;
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar4 = 0x1c - (uVar1 ^ 0x1f);
    uVar3 = (ulong)(iVar4 * 0x20 + (uVar2 >> ((byte)iVar4 & 0x1f) & 7) * 4);
    iVar6 = ((int)uVar7 - *(int *)(model_rd_norm_xsq_iq_q10 + uVar3)) * 0x400 >>
            (0x1eU - (char)(uVar1 ^ 0x1f) & 0x1f);
    iVar4 = ((*(int *)(model_rd_norm_rate_tab_q10 + uVar3 + 4) * iVar6 +
              *(int *)(model_rd_norm_rate_tab_q10 + uVar3) * (0x400 - iVar6) >> 10) <<
            ((byte)n_log2 & 0x1f)) + 1 >> 1;
    lVar5 = (iVar6 * *(int *)(model_rd_norm_dist_tab_q10 + uVar3 + 4) +
             (0x400 - iVar6) * *(int *)(model_rd_norm_dist_tab_q10 + uVar3) >> 10) * var + 0x200 >>
            10;
  }
  *rate = iVar4;
  *dist = lVar5;
  return;
}

Assistant:

void av1_model_rd_from_var_lapndz(int64_t var, unsigned int n_log2,
                                  unsigned int qstep, int *rate,
                                  int64_t *dist) {
  // This function models the rate and distortion for a Laplacian
  // source with given variance when quantized with a uniform quantizer
  // with given stepsize. The closed form expressions are in:
  // Hang and Chen, "Source Model for transform video coder and its
  // application - Part I: Fundamental Theory", IEEE Trans. Circ.
  // Sys. for Video Tech., April 1997.
  if (var == 0) {
    *rate = 0;
    *dist = 0;
  } else {
    int d_q10, r_q10;
    static const uint32_t MAX_XSQ_Q10 = 245727;
    const uint64_t xsq_q10_64 =
        (((uint64_t)qstep * qstep << (n_log2 + 10)) + (var >> 1)) / var;
    const int xsq_q10 = (int)AOMMIN(xsq_q10_64, MAX_XSQ_Q10);
    model_rd_norm(xsq_q10, &r_q10, &d_q10);
    *rate = ROUND_POWER_OF_TWO(r_q10 << n_log2, 10 - AV1_PROB_COST_SHIFT);
    *dist = (var * (int64_t)d_q10 + 512) >> 10;
  }
}